

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::Init(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
       *this)

{
  Arena *this_00;
  ulong uVar1;
  InnerMap *this_01;
  void **ppvVar2;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    this_01 = (InnerMap *)operator_new(0x30);
    this_01->num_elements_ = 0;
    uVar1 = rdtsc();
    this_01->seed_ =
         (long)&this_01->num_elements_ + (uVar1 & 0xffffffff00000000) + (uVar1 & 0xffffffff);
    this_01->table_ = (void **)0x0;
    (this_01->alloc_).arena_ = (Arena *)0x0;
    ppvVar2 = InnerMap::CreateEmptyTable(this_01,8);
    this_01->table_ = ppvVar2;
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation
                (this_00,(type_info *)
                         &Map<std::__cxx11::string,google::protobuf::Value>::InnerMap::typeinfo,0x30
                );
    }
    this_01 = (InnerMap *)Arena::AllocateAlignedNoHook(this_00,0x30);
    this_01->num_elements_ = 0;
    uVar1 = rdtsc();
    this_01->seed_ =
         (long)&this_01->num_elements_ + (uVar1 & 0xffffffff) + (uVar1 & 0xffffffff00000000);
    this_01->table_ = (void **)0x0;
    (this_01->alloc_).arena_ = this_00;
    ppvVar2 = InnerMap::CreateEmptyTable(this_01,8);
    this_01->table_ = ppvVar2;
  }
  this_01->index_of_first_non_null_ = 8;
  this_01->num_buckets_ = 8;
  this->elements_ = this_01;
  return;
}

Assistant:

void Init() { elements_ = Arena::CreateMessage<InnerMap>(arena_, 0u); }